

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse.cpp
# Opt level: O1

string_t __thiscall
duckdb::ReverseOperator::Operation<duckdb::string_t,duckdb::string_t>
          (ReverseOperator *this,string_t input,Vector *result)

{
  Vector *pVVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  char *s;
  undefined1 *puVar5;
  Vector *pVVar6;
  Vector *vector;
  bool bVar7;
  GraphemeIterator GVar8;
  GraphemeCluster GVar9;
  string_t target;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  undefined1 local_90 [16];
  undefined8 local_80;
  char *local_78;
  GraphemeClusterIterator local_70;
  GraphemeClusterIterator local_50;
  
  local_78 = input.value._0_8_;
  vector = (Vector *)((ulong)this & 0xffffffff);
  s = local_78;
  if (vector < (Vector *)0xd) {
    s = (char *)((long)&local_80 + 4);
  }
  local_80 = this;
  local_90 = (undefined1  [16])
             StringVector::EmptyString(input.value._8_8_,vector,(idx_t)input.value._8_8_);
  puVar5 = local_90._8_8_;
  if (local_90._0_4_ < 0xd) {
    puVar5 = local_90 + 4;
  }
  bVar7 = vector == (Vector *)0x0;
  if ((!bVar7) && (cVar2 = *s, -1 < cVar2)) {
    pcVar4 = puVar5 + (long)&vector->vector_type;
    pVVar1 = (Vector *)&DAT_00000001;
    do {
      pVVar6 = pVVar1;
      pcVar4 = pcVar4 + -1;
      *pcVar4 = cVar2;
      if (vector == pVVar6) break;
      cVar2 = s[(long)pVVar6];
      pVVar1 = (Vector *)&pVVar6->field_0x1;
    } while (-1 < cVar2);
    bVar7 = vector <= pVVar6;
  }
  if (!bVar7) {
    GVar8 = Utf8Proc::GraphemeClusters(s,(size_t)vector);
    GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator(&local_50,GVar8.s,GVar8.len);
    GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator(&local_70,(char *)0x0,0);
    bVar7 = GraphemeIterator::GraphemeClusterIterator::operator!=(&local_50,&local_70);
    if (bVar7) {
      do {
        GVar9 = GraphemeIterator::GraphemeClusterIterator::operator*(&local_50);
        switchD_00b1422a::default
                  (puVar5 + (long)vector + -GVar9.end,s + GVar9.start,GVar9.end - GVar9.start);
        GraphemeIterator::GraphemeClusterIterator::operator++(&local_50);
        bVar7 = GraphemeIterator::GraphemeClusterIterator::operator!=(&local_50,&local_70);
      } while (bVar7);
    }
  }
  uVar3 = (ulong)(uint)local_90._0_4_;
  if (uVar3 < 0xd) {
    switchD_005700f1::default(local_90 + 4 + uVar3,0,0xc - uVar3);
  }
  else {
    local_90._4_4_ = *(undefined4 *)local_90._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_90;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();

		auto target = StringVector::EmptyString(result, input_length);
		auto target_data = target.GetDataWriteable();
		if (!StrReverseASCII(input_data, input_length, target_data)) {
			StrReverseUnicode(input_data, input_length, target_data);
		}
		target.Finalize();
		return target;
	}